

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O0

CharGroup_ * kj::anon_unknown_0::getEndQueryPart(Context context)

{
  CharGroup_ *pCStack_10;
  Context context_local;
  
  if (context == REMOTE_HREF) {
    pCStack_10 = &getEndQueryPart::END_QUERY_PART_HREF;
  }
  else if (context == HTTP_PROXY_REQUEST) {
    pCStack_10 = &getEndQueryPart::END_QUERY_PART_REQUEST;
  }
  else {
    if (context != HTTP_REQUEST) {
      kj::_::unreachable();
    }
    pCStack_10 = &getEndQueryPart::END_QUERY_PART_REQUEST;
  }
  return pCStack_10;
}

Assistant:

const parse::CharGroup_& getEndQueryPart(Url::Context context) {
  static constexpr auto END_QUERY_PART_HREF = parse::anyOfChars("&#");
  static constexpr auto END_QUERY_PART_REQUEST = parse::anyOfChars("&");

  switch (context) {
    case Url::REMOTE_HREF:        return END_QUERY_PART_HREF;
    case Url::HTTP_PROXY_REQUEST: return END_QUERY_PART_REQUEST;
    case Url::HTTP_REQUEST:       return END_QUERY_PART_REQUEST;
  }

  KJ_UNREACHABLE;
}